

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

optional<bool>
anon_unknown.dwarf_f7d1a::AdjustRPathELF
          (string *file,EmptyCallback *emptyCallback,AdjustCallback *adjustCallback,string *emsg,
          bool *changed)

{
  char *__args_2;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  StringEntry *pSVar6;
  StringEntry *pSVar7;
  unsigned_long uVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ushort uVar11;
  size_type sVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  ulong local_3c0;
  StringEntry *se [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outRPath;
  char *se_name [2];
  cmELF elf;
  cmAlphaNum local_328;
  cmSystemToolsRPathInfo rp [2];
  string local_250;
  ofstream f;
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar5 = 0xa0;
  paVar10 = &rp[0].Name.field_2;
  do {
    (((string *)(paVar10 + -1))->_M_dataplus)._M_p = (pointer)paVar10;
    *(size_type *)((long)paVar10 + -8) = 0;
    paVar10->_M_local_buf[0] = '\0';
    paVar10[1]._M_allocated_capacity = (size_type)(paVar10 + 2);
    *(undefined8 *)((long)paVar10 + 0x18) = 0;
    paVar10[2]._M_local_buf[0] = 0;
    paVar10 = paVar10 + 5;
    lVar5 = lVar5 + -0x50;
  } while (lVar5 != 0);
  cmELF::cmELF(&elf,(file->_M_dataplus)._M_p);
  bVar2 = cmELF::Valid(&elf);
  if (!bVar2) {
    uVar16 = 0;
    bVar13 = true;
    uVar11 = 0;
    bVar2 = false;
    uVar4 = 0;
    goto LAB_00169c10;
  }
  se[0] = (StringEntry *)0x0;
  se[1] = (StringEntry *)0x0;
  se_name[0] = (char *)0x0;
  se_name[1] = (char *)0x0;
  pSVar6 = cmELF::GetRPath(&elf);
  if (pSVar6 != (StringEntry *)0x0) {
    se_name[0] = "RPATH";
    se[0] = pSVar6;
  }
  uVar4 = (uint)(pSVar6 != (StringEntry *)0x0);
  pSVar7 = cmELF::GetRunPath(&elf);
  if (pSVar7 == (StringEntry *)0x0) {
    if (pSVar6 != (StringEntry *)0x0) {
      local_3c0 = 1;
      goto LAB_00169a76;
    }
    bVar2 = std::
            function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
            ::operator()(emptyCallback,emsg,&elf);
    uVar16 = (ushort)bVar2;
    bVar2 = false;
    bVar13 = true;
    uVar4 = 0;
  }
  else {
    uVar15 = (ulong)(uVar4 * 8);
    *(StringEntry **)((long)se + uVar15) = pSVar7;
    *(char **)((long)se_name + uVar15) = "RUNPATH";
    local_3c0 = (ulong)(uVar4 + 1);
LAB_00169a76:
    bVar13 = true;
    uVar4 = 0;
    for (uVar15 = 0; bVar2 = local_3c0 == uVar15, !bVar2; uVar15 = uVar15 + 1) {
      if (uVar4 == 0) {
        pSVar6 = se[uVar15];
        uVar8 = pSVar6->Position;
LAB_00169ac7:
        rp[(int)uVar4].Position = uVar8;
        rp[(int)uVar4].Size = pSVar6->Size;
        __args_2 = se_name[uVar15];
        std::__cxx11::string::assign((char *)&rp[(int)uVar4].Name);
        outRPath.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        bVar3 = std::
                function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                ::operator()(adjustCallback,&outRPath,&pSVar6->Value,__args_2,emsg);
        if (bVar3) {
          bVar3 = true;
          if (outRPath.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged == true) {
            bVar13 = (bool)(bVar13 & outRPath.
                                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ._M_payload._M_value._M_string_length == 0);
            if (rp[(int)uVar4].Size <
                outRPath.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length + 1) {
              if (emsg != (string *)0x0) {
                f.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)&DAT_00000029;
                f.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = anon_var_dwarf_fc797;
                local_328.View_._M_len = strlen(__args_2);
                local_328.View_._M_str = __args_2;
                cmStrCat<char[8]>(&local_250,(cmAlphaNum *)&f,&local_328,(char (*) [8])0x5652d1);
                std::__cxx11::string::operator=((string *)emsg,(string *)&local_250);
                std::__cxx11::string::~string((string *)&local_250);
              }
              goto LAB_00169bc4;
            }
            std::__cxx11::string::operator=((string *)&rp[(int)uVar4].Value,(string *)&outRPath);
            uVar4 = uVar4 + 1;
          }
          else {
            bVar13 = false;
          }
        }
        else {
LAB_00169bc4:
          bVar3 = false;
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&outRPath);
        if (!bVar3) break;
      }
      else {
        pSVar6 = se[uVar15];
        uVar8 = pSVar6->Position;
        if (rp[0].Position != uVar8) goto LAB_00169ac7;
      }
    }
    uVar16 = 0;
  }
  uVar11 = 0x100;
LAB_00169c10:
  cmELF::~cmELF(&elf);
  if (bVar2) {
    uVar11 = 0x100;
    uVar16 = 1;
    if (uVar4 != 0) {
      if (bVar13) {
        bVar2 = cmSystemTools::RemoveRPath(file,emsg,changed);
        uVar16 = (ushort)bVar2;
      }
      else {
        std::ofstream::ofstream(&f,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
        if (((&f.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)f.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] &
            5) == 0) {
          uVar15 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar15 = 0;
          }
          uVar1 = 0;
          do {
            uVar14 = uVar1;
            if (uVar14 == uVar15) {
              std::ofstream::~ofstream(&f);
              uVar16 = 1;
              if (changed != (bool *)0x0) {
                *changed = true;
              }
              goto LAB_00169e52;
            }
            plVar9 = (long *)std::ostream::seekp(&f,rp[uVar14].Position,0);
            if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
              if (emsg == (string *)0x0) goto LAB_00169e42;
              local_328.View_._M_len = 0x11;
              local_328.View_._M_str = "Error seeking to ";
              elf.ErrorMessage._M_dataplus._M_p = rp[uVar14].Name._M_dataplus._M_p;
              elf.Internal._M_t.
              super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>._M_t.
              super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
              super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl =
                   (__uniq_ptr_data<cmELFInternal,_std::default_delete<cmELFInternal>,_true,_true>)
                   rp[uVar14].Name._M_string_length;
              cmStrCat<char[11]>((string *)&outRPath,&local_328,(cmAlphaNum *)&elf,
                                 (char (*) [11])0x56b291);
              goto LAB_00169e28;
            }
            std::operator<<(&f.super_basic_ostream<char,_std::char_traits<char>_>,
                            (string *)&rp[uVar14].Value);
            for (sVar12 = rp[uVar14].Value._M_string_length; sVar12 < rp[uVar14].Size;
                sVar12 = sVar12 + 1) {
              std::operator<<(&f.super_basic_ostream<char,_std::char_traits<char>_>,'\0');
            }
            uVar1 = uVar14 + 1;
          } while (((&f.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
                    [(long)f.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                           [-3]] & 5) == 0);
          if (emsg != (string *)0x0) {
            local_328.View_._M_len = 0x16;
            local_328.View_._M_str = "Error writing the new ";
            elf.ErrorMessage._M_dataplus._M_p = rp[uVar14].Name._M_dataplus._M_p;
            elf.Internal._M_t.
            super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>._M_t.
            super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
            super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmELFInternal,_std::default_delete<cmELFInternal>,_true,_true>)
                 rp[uVar14].Name._M_string_length;
            cmStrCat<char[21]>((string *)&outRPath,&local_328,(cmAlphaNum *)&elf,
                               (char (*) [21])0x56b2b9);
LAB_00169e28:
            std::__cxx11::string::operator=((string *)emsg,(string *)&outRPath);
            std::__cxx11::string::~string((string *)&outRPath);
          }
LAB_00169e42:
          std::ofstream::~ofstream(&f);
          uVar16 = 0;
LAB_00169e52:
          uVar11 = 0x100;
        }
        else {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::assign((char *)emsg);
          }
          std::ofstream::~ofstream(&f);
          uVar16 = 0;
        }
      }
    }
  }
  lVar5 = 0x50;
  do {
    cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo
              ((cmSystemToolsRPathInfo *)((long)&rp[0].Position + lVar5));
    lVar5 = lVar5 + -0x50;
  } while (lVar5 != -0x50);
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar16 | uVar11);
}

Assistant:

cm::optional<bool> AdjustRPathELF(std::string const& file,
                                  const EmptyCallback& emptyCallback,
                                  const AdjustCallback& adjustCallback,
                                  std::string* emsg, bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());
    if (!elf) {
      return cm::nullopt; // Not a valid ELF file.
    }

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      return emptyCallback(emsg, elf);
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      // Adjust the rpath.
      cm::optional<std::string> outRPath;
      if (!adjustCallback(outRPath, se[i]->Value, se_name[i], emsg)) {
        return false;
      }

      if (outRPath) {
        if (!outRPath->empty()) {
          remove_rpath = false;
        }

        // Make sure there is enough room to store the new rpath and at
        // least one null terminator.
        if (rp[rp_count].Size < outRPath->length() + 1) {
          if (emsg) {
            *emsg = cmStrCat("The replacement path is too long for the ",
                             se_name[i], " entry.");
          }
          return false;
        }

        // This entry is ready for update.
        rp[rp_count].Value = std::move(*outRPath);
        ++rp_count;
      } else {
        remove_rpath = false;
      }
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = cmStrCat("Error seeking to ", rp[i].Name, " position.");
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = cmStrCat("Error writing the new ", rp[i].Name,
                           " string to the file.");
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}